

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

string * __thiscall
SchemeCompoundProcedure::external_repr_abi_cxx11_
          (string *__return_storage_ptr__,SchemeCompoundProcedure *this)

{
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->super_SchemeProcedure).name._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_50,"",&local_51);
  }
  else {
    std::operator+(&local_50," ",&(this->super_SchemeProcedure).name);
  }
  std::operator+(&local_30,"<compound-procedure",&local_50);
  std::operator+(__return_storage_ptr__,&local_30,">");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeCompoundProcedure::external_repr() const
{
    return "<compound-procedure" + (name.empty() ? "" : (" " + name)) + ">";
}